

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int __thiscall iqnet::Socket::listen(Socket *this,int __fd,int __n)

{
  network_error *this_00;
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = ::listen(this->sock,__fd);
  if (iVar1 != -1) {
    return iVar1;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Socket::listen",&local_39)
  ;
  network_error::network_error(this_00,&local_38,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::listen( unsigned blog )
{
  if( ::listen( sock, blog ) == -1 )
    throw network_error( "Socket::listen" );
}